

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

void __thiscall ThreadContext::ClearInlineCaches(ThreadContext *this)

{
  bool bVar1;
  InlineCacheAllocator *pIVar2;
  size_t sVar3;
  ScriptContext *local_40;
  ScriptContext *scriptContext;
  ScriptContext *scriptContext_1;
  ulong uStack_28;
  uint scriptContextCount;
  size_t polyInlineCacheSize;
  size_t freeListSize;
  size_t size;
  ThreadContext *this_local;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineCachePhase);
  if (bVar1) {
    freeListSize = 0;
    polyInlineCacheSize = 0;
    uStack_28 = 0;
    scriptContext_1._4_4_ = 0;
    for (scriptContext = this->scriptContextList; scriptContext != (ScriptContext *)0x0;
        scriptContext = scriptContext->next) {
      scriptContext_1._4_4_ = scriptContext_1._4_4_ + 1;
      pIVar2 = Js::ScriptContext::GetInlineCacheAllocator(scriptContext);
      sVar3 = Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
              AllocatedSize(&pIVar2->
                             super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                           );
      freeListSize = sVar3 + freeListSize;
      pIVar2 = Js::ScriptContext::GetInlineCacheAllocator(scriptContext);
      sVar3 = Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
              FreeListSize(&pIVar2->
                            super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                          );
      polyInlineCacheSize = sVar3 + polyInlineCacheSize;
      pIVar2 = Js::ScriptContext::GetInlineCacheAllocator(scriptContext);
      sVar3 = Memory::InlineCacheAllocator::GetPolyInlineCacheSize(pIVar2);
      uStack_28 = sVar3 + uStack_28;
    }
    Output::Print(L"Inline cache arena: total = %5I64u KB, free list = %5I64u KB, poly caches = %5I64u KB, script contexts = %u\n"
                  ,freeListSize >> 10,polyInlineCacheSize >> 10,uStack_28 >> 10,
                  (ulong)scriptContext_1._4_4_);
  }
  for (local_40 = this->scriptContextList; local_40 != (ScriptContext *)0x0;
      local_40 = local_40->next) {
    Js::ScriptContext::ClearInlineCaches(local_40);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
            (&(this->inlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::ResetNoDelete(&this->protoInlineCacheByPropId);
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::ResetNoDelete(&this->storeFieldInlineCacheByPropId);
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  return;
}

Assistant:

void
ThreadContext::ClearInlineCaches()
{
    if (PHASE_TRACE1(Js::InlineCachePhase))
    {
        size_t size = 0;
        size_t freeListSize = 0;
        size_t polyInlineCacheSize = 0;
        uint scriptContextCount = 0;
        for (Js::ScriptContext *scriptContext = scriptContextList;
            scriptContext;
            scriptContext = scriptContext->next)
        {
            scriptContextCount++;
            size += scriptContext->GetInlineCacheAllocator()->AllocatedSize();
            freeListSize += scriptContext->GetInlineCacheAllocator()->FreeListSize();
#ifdef POLY_INLINE_CACHE_SIZE_STATS
            polyInlineCacheSize += scriptContext->GetInlineCacheAllocator()->GetPolyInlineCacheSize();
#endif
        };
        Output::Print(_u("Inline cache arena: total = %5I64u KB, free list = %5I64u KB, poly caches = %5I64u KB, script contexts = %u\n"),
            static_cast<uint64>(size / 1024), static_cast<uint64>(freeListSize / 1024), static_cast<uint64>(polyInlineCacheSize / 1024), scriptContextCount);
    }

    Js::ScriptContext *scriptContext = this->scriptContextList;
    while (scriptContext != nullptr)
    {
        scriptContext->ClearInlineCaches();
        scriptContext = scriptContext->next;
    }

    inlineCacheThreadInfoAllocator.Reset();
    protoInlineCacheByPropId.ResetNoDelete();
    storeFieldInlineCacheByPropId.ResetNoDelete();

    registeredInlineCacheCount = 0;
    unregisteredInlineCacheCount = 0;
}